

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::SerializerTest_shouldRestoreStreamState_Test::
~SerializerTest_shouldRestoreStreamState_Test(SerializerTest_shouldRestoreStreamState_Test *this)

{
  SerializerTest::~SerializerTest(&this->super_SerializerTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SerializerTest, shouldRestoreStreamState) {
  std::ostringstream os;

  // save stream state
  auto saved_flags = os.flags();
  auto saved_precision = os.precision();
  auto saved_width = os.width();
  auto saved_fill = os.fill();
  auto saved_locale = os.getloc();

  // serialize
  textSerializer.Serialize(os, collected);

  // check for expected flags
  EXPECT_EQ(os.flags(), saved_flags);
  EXPECT_EQ(os.precision(), saved_precision);
  EXPECT_EQ(os.width(), saved_width);
  EXPECT_EQ(os.fill(), saved_fill);
  EXPECT_EQ(os.getloc(), saved_locale);
}